

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

void remove_a_file(string *file_name)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = remove((file_name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    std::operator+(&local_30,"\n!! Problems deleting file_name \'",file_name);
    std::operator+(&local_50,&local_30,"\'. Aborting!\n");
    write_colored_text(&local_50,red);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void remove_a_file(const string &file_name) {
    // See also https://www.geeksforgeeks.org/c-program-delete-file/
    if (remove(file_name.c_str()) != 0) {
        write_colored_text("\n!! Problems deleting file_name '" + file_name + "'. Aborting!\n");
        return;
    }
}